

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O1

void __thiscall pg::SSPMSolver::run(SSPMSolver *this)

{
  int iVar1;
  int iVar2;
  Game *pGVar3;
  ulong uVar4;
  size_t sVar5;
  bool bVar6;
  int iVar7;
  uint *puVar8;
  ostream *poVar9;
  size_t sVar10;
  size_t sVar11;
  int depth;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint n_bits;
  uint uVar17;
  
  pGVar3 = (this->super_Solver).game;
  uVar4 = pGVar3->n_vertices;
  iVar7 = *(int *)((long)pGVar3->_priority + ((long)((uVar4 << 0x20) + -0x100000000) >> 0x1e));
  uVar14 = (uint)((uVar4 - 1 & uVar4) != 0);
  uVar12 = 0x20;
  lVar13 = 0;
  uVar15 = uVar4;
  do {
    uVar16 = 0;
    if ((*(ulong *)((long)&ceil_log2(unsigned_long_long)::t + lVar13) & uVar15) != 0) {
      uVar16 = uVar12;
    }
    uVar14 = uVar14 + (int)uVar16;
    uVar15 = uVar15 >> uVar16;
    uVar12 = uVar12 >> 1;
    lVar13 = lVar13 + 8;
  } while (lVar13 != 0x30);
  depth = iVar7 / 2 + 1;
  iVar7 = (iVar7 + 1) - (iVar7 + 1 >> 0x1f) >> 1;
  (this->Q).pointer = 0;
  puVar8 = (this->Q).queue;
  if (puVar8 != (uint *)0x0) {
    operator_delete__(puVar8);
  }
  puVar8 = (uint *)operator_new__((uVar4 & 0xffffffff) << 2);
  (this->Q).queue = puVar8;
  bitset::resize(&this->dirty,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->unstable,((this->super_Solver).game)->n_vertices);
  poVar9 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"even wants ",0xb);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"-bounded adaptive ",0x12);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,depth);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"-counters.",10);
  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  poVar9 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"odd wants ",10);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"-bounded adaptive ",0x12);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"-counters.",10);
  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  n_bits = 1;
  if (this->bounded == false) {
    n_bits = uVar14;
  }
  if (n_bits <= uVar14) {
    do {
      iVar1 = this->lift_count;
      iVar2 = this->lift_attempt;
      pGVar3 = (this->super_Solver).game;
      lVar13 = pGVar3->n_vertices;
      sVar10 = bitset::count(&pGVar3->solved);
      run(this,n_bits,iVar7,1);
      pGVar3 = (this->super_Solver).game;
      sVar5 = pGVar3->n_vertices;
      sVar11 = bitset::count(&pGVar3->solved);
      poVar9 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"after odd  with k=",0x12);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,n_bits);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      *(undefined8 *)(&poVar9->field_0x10 + (long)poVar9->_vptr_basic_ostream[-3]) = 9;
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->lift_count - iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," lifts, ",8);
      *(undefined8 *)(&poVar9->field_0x10 + (long)poVar9->_vptr_basic_ostream[-3]) = 9;
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->lift_attempt - iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," lift attempts, ",0x10);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," unsolved left.",0xf);
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      if (sVar5 == sVar11) {
        bVar6 = false;
      }
      else {
        run(this,n_bits,depth,0);
        pGVar3 = (this->super_Solver).game;
        sVar5 = pGVar3->n_vertices;
        sVar11 = bitset::count(&pGVar3->solved);
        poVar9 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"after even with k=",0x12);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,n_bits);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
        *(undefined8 *)(&poVar9->field_0x10 + (long)poVar9->_vptr_basic_ostream[-3]) = 9;
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->lift_count - iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," lifts, ",8);
        *(undefined8 *)(&poVar9->field_0x10 + (long)poVar9->_vptr_basic_ostream[-3]) = 9;
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->lift_attempt - iVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," lift attempts, ",0x10);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," unsolved left.",0xf);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        if (n_bits == uVar14 || sVar5 == sVar11) {
          bVar6 = false;
        }
        else {
          n_bits = n_bits - (lVar13 - sVar10 != sVar5 - sVar11);
          bVar6 = true;
        }
      }
    } while ((bVar6) &&
            (uVar17 = n_bits + 1, bVar6 = (int)n_bits < (int)uVar14, n_bits = uVar17, bVar6));
  }
  poVar9 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"solved with ",0xc);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->lift_count);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," lifts, ",8);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->lift_attempt);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," lift attempts, max l ",0x16);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,n_bits);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,".",1);
  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  return;
}

Assistant:

void
SSPMSolver::run()
{
    int max_prio = priority(nodecount()-1);

    // compute ml (max l) and the h for even/odd
    int ml = ceil_log2(nodecount());
    int h0 = (max_prio/2)+1;
    int h1 = (max_prio+1)/2;

    // create datastructures
    Q.resize(nodecount());
    dirty.resize(nodecount());
    unstable.resize(nodecount());

    logger << "even wants " << ml << "-bounded adaptive " << h0 << "-counters." << std::endl;
    logger << "odd wants " << ml << "-bounded adaptive " << h1 << "-counters." << std::endl;

    // if running bounded sspm, start with 1-bounded adaptive counters
    int i = bounded ? 1 : ml;

    for (; i<=ml; i++) {
        int _l = lift_count, _a = lift_attempt;
        uint64_t _c = game.count_unsolved(), c;

        if (ODDFIRST) {
            // run odd counters
            run(i, h1, 1);
            c = game.count_unsolved();
            logger << "after odd  with k=" << i << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;

            // if now solved, no need to run odd counters
            if (c == 0) break;

            // run even counters
            run(i, h0, 0);
            c = game.count_unsolved();
            logger << "after even with k=" << i << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;
        } else {
            // run even counters
            run(i, h0, 0);
            c = game.count_unsolved();
            logger << "after even with k=" << i << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;

            // if now solved, no need to run odd counters
            if (c == 0) break;

            // run odd counters
            run(i, h1, 1);
            c = game.count_unsolved();
            logger << "after odd  with k=" << i << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;
        }

        if (i != ml) {
            // if i == ml then we are guaranteed to be done
            // otherwise check if done
            if (c == 0) break;
            if (_c != c) i--; // do not increase i if we solved vertices with current i
        } else {
            break; // do not count higher pls
        }
    }

    logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts, max l " << i << "." << std::endl;
}